

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrgload.c
# Opt level: O3

FT_Error pfr_glyph_load_rec(PFR_Glyph glyph,FT_Stream stream,FT_ULong gps_offset,FT_ULong offset,
                           FT_ULong size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte *pbVar3;
  FT_GlyphLoader pFVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  byte bVar7;
  FT_Error FVar8;
  PFR_SubGlyphRec *pPVar9;
  FT_Pos *pFVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ushort *puVar15;
  FT_Vector *pFVar16;
  uint uVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  byte bVar20;
  ushort *puVar21;
  uint uVar22;
  ushort *puVar23;
  ushort *puVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar31;
  int iVar33;
  undefined1 auVar34 [16];
  FT_Error local_a4;
  ulong local_a0;
  FT_Pos **local_98;
  ushort *local_90;
  FT_GlyphLoader local_88;
  uint local_7c;
  undefined1 local_78 [8];
  ulong uStack_70;
  FT_Vector local_68 [2];
  undefined1 local_48 [16];
  ulong uVar30;
  undefined1 auVar32 [16];
  
  FVar8 = FT_Stream_Seek(stream,offset + gps_offset);
  if (FVar8 != 0) {
    return FVar8;
  }
  FVar8 = FT_Stream_EnterFrame(stream,size);
  if (FVar8 != 0) {
    return FVar8;
  }
  if (size != 0) {
    pbVar3 = stream->cursor;
    puVar21 = (ushort *)(pbVar3 + size);
    if ((char)*pbVar3 < '\0') {
      pFVar4 = glyph->loader;
      uVar12 = (ulong)glyph->num_subs;
      auVar5._12_4_ = 0;
      auVar5._0_12_ = stack0xffffffffffffff8c;
      _local_78 = (FT_Vector)(auVar5 << 0x20);
      if ((0 < (long)size) && (bVar7 = *pbVar3, (char)bVar7 < '\0')) {
        puVar23 = (ushort *)(pbVar3 + 1);
        if ((bVar7 & 0x40) != 0) {
          if (size == 1) goto LAB_0014b0f4;
          puVar23 = (ushort *)(pbVar3 + 2);
          bVar20 = (byte)*(ushort *)(pbVar3 + 1);
          uVar27 = (uint)bVar20;
          if (bVar20 != 0) {
            do {
              if ((puVar21 < puVar23 + 1) ||
                 (puVar23 = (ushort *)((long)(puVar23 + 1) + (ulong)(byte)*puVar23),
                 puVar21 < puVar23)) goto LAB_0014b0f4;
              uVar27 = uVar27 - 1;
            } while (uVar27 != 0);
          }
        }
        uVar27 = bVar7 & 0x3f;
        uVar22 = glyph->num_subs + uVar27;
        local_88 = pFVar4;
        if (uVar22 <= glyph->max_subs) {
          pPVar9 = glyph->subs;
LAB_0014ad2f:
          if (uVar27 != 0) {
            lVar11 = 0;
            do {
              puVar24 = (ushort *)((long)puVar23 + 1);
              if (puVar21 < puVar24) goto LAB_0014b0f4;
              bVar7 = (byte)*puVar23;
              *(undefined8 *)((long)&pPVar9[uVar12].x_scale + lVar11) = 0x10000;
              if ((bVar7 & 0x10) != 0) {
                puVar24 = (ushort *)((long)puVar23 + 3);
                if (puVar21 < puVar24) goto LAB_0014b0f4;
                *(ulong *)((long)&pPVar9[uVar12].x_scale + lVar11) =
                     ((long)(short)((ushort)*(byte *)((long)puVar23 + 1) << 8) |
                     (ulong)(byte)puVar23[1]) << 4;
              }
              *(undefined8 *)((long)&pPVar9[uVar12].y_scale + lVar11) = 0x10000;
              if ((bVar7 & 0x20) != 0) {
                if (puVar21 < puVar24 + 1) goto LAB_0014b0f4;
                *(ulong *)((long)&pPVar9[uVar12].y_scale + lVar11) =
                     ((long)(short)((ushort)(byte)*puVar24 << 8) |
                     (ulong)*(byte *)((long)puVar24 + 1)) << 4;
                puVar24 = puVar24 + 1;
              }
              if ((bVar7 & 3) == 2) {
                if (puVar21 < (ushort *)((long)puVar24 + 1U)) goto LAB_0014b0f4;
                uVar22 = (uint)(char)(byte)*puVar24;
                puVar24 = (ushort *)((long)puVar24 + 1U);
              }
              else {
                uVar22 = 0;
                if ((bVar7 & 3) == 1) {
                  if (puVar21 < puVar24 + 1) goto LAB_0014b0f4;
                  uVar22 = (int)(short)((ushort)(byte)*puVar24 << 8) |
                           (uint)*(byte *)((long)puVar24 + 1);
                  puVar24 = puVar24 + 1;
                }
              }
              bVar20 = bVar7 >> 2 & 3;
              if (bVar20 == 2) {
                if (puVar21 < (ushort *)((long)puVar24 + 1U)) goto LAB_0014b0f4;
                uVar25 = (uint)(char)(byte)*puVar24;
                puVar24 = (ushort *)((long)puVar24 + 1U);
              }
              else {
                uVar25 = 0;
                if (bVar20 == 1) {
                  if (puVar21 < puVar24 + 1) goto LAB_0014b0f4;
                  uVar25 = (int)(short)((ushort)(byte)*puVar24 << 8) |
                           (uint)*(byte *)((long)puVar24 + 1);
                  puVar24 = puVar24 + 1;
                }
              }
              *(uint *)((long)&pPVar9[uVar12].x_delta + lVar11) = uVar22;
              *(uint *)((long)&pPVar9[uVar12].y_delta + lVar11) = uVar25;
              if ((bVar7 & 0x40) == 0) {
                puVar15 = (ushort *)((long)puVar24 + 1);
                if (puVar21 < puVar15) goto LAB_0014b0f4;
                uVar22 = (uint)(byte)*puVar24;
              }
              else {
                puVar15 = puVar24 + 1;
                if (puVar21 < puVar15) goto LAB_0014b0f4;
                uVar22 = (uint)(ushort)(*puVar24 << 8 | *puVar24 >> 8);
              }
              *(uint *)((long)&pPVar9[uVar12].gps_size + lVar11) = uVar22;
              if ((char)bVar7 < '\0') {
                puVar23 = (ushort *)((long)puVar15 + 3);
                if (puVar21 < puVar23) goto LAB_0014b0f4;
                uVar22 = (uint)*(byte *)((long)puVar15 + 1) << 8 | (uint)(byte)*puVar15 << 0x10;
                lVar18 = 2;
              }
              else {
                puVar23 = puVar15 + 1;
                if (puVar21 < puVar23) goto LAB_0014b0f4;
                uVar22 = (uint)(byte)*puVar15 << 8;
                lVar18 = 1;
              }
              *(uint *)((long)&pPVar9[uVar12].gps_offset + lVar11) =
                   *(byte *)((long)puVar15 + lVar18) | uVar22;
              glyph->num_subs = glyph->num_subs + 1;
              lVar11 = lVar11 + 0x20;
            } while (uVar27 << 5 != (int)lVar11);
          }
          FT_Stream_ExitFrame(stream);
          if (glyph->num_subs == (FT_UInt)uVar12) {
            return 0;
          }
          local_98 = (FT_Pos **)(ulong)(glyph->num_subs - (FT_UInt)uVar12);
          pPVar9 = glyph->subs;
          uVar27 = (uint)(ushort)(local_88->base).outline.n_points;
          uVar26 = 0;
          do {
            local_90 = (ushort *)CONCAT62(local_90._2_6_,(short)uVar27);
            local_a0 = uVar26;
            FVar8 = pfr_glyph_load_rec(glyph,stream,gps_offset,
                                       (ulong)pPVar9[uVar12 + uVar26].gps_offset,
                                       (ulong)pPVar9[uVar12 + uVar26].gps_size);
            if (FVar8 != 0) {
              return FVar8;
            }
            pPVar9 = glyph->subs;
            uVar27 = (uint)(local_88->base).outline.n_points;
            iVar13 = uVar27 - (int)(short)local_90;
            uVar14 = pPVar9[uVar12 + uVar26].x_scale;
            if ((uVar14 == 0x10000) && (pPVar9[uVar12 + uVar26].y_scale == 0x10000)) {
              if (0 < iVar13) {
                pFVar16 = (local_88->base).outline.points + (short)local_90;
                lVar11._0_4_ = pPVar9[uVar12 + uVar26].x_delta;
                lVar11._4_4_ = pPVar9[uVar12 + uVar26].y_delta;
                auVar28._8_4_ = lVar11._4_4_;
                auVar28._0_8_ = lVar11;
                auVar28._12_4_ = -(uint)(lVar11 < 0);
                do {
                  pFVar16->x = pFVar16->x +
                               CONCAT44(-(uint)((int)(undefined4)lVar11 < 0),(undefined4)lVar11);
                  pFVar16->y = pFVar16->y + auVar28._8_8_;
                  pFVar16 = pFVar16 + 1;
                  iVar13 = iVar13 + -1;
                } while (iVar13 != 0);
              }
            }
            else if (0 < iVar13) {
              pFVar16 = (local_88->base).outline.points + (short)local_90;
              iVar31 = (int)pPVar9[uVar12 + uVar26].y_scale;
              auVar29._4_4_ = iVar31;
              auVar29._0_4_ = (int)uVar14;
              auVar29._8_4_ = iVar31;
              auVar29._12_4_ = iVar31 >> 0x1f;
              uVar30 = auVar29._8_8_;
              uVar1 = pPVar9[uVar12 + uVar26].x_delta;
              uVar2 = pPVar9[uVar12 + uVar26].y_delta;
              do {
                uVar26 = pFVar16->x;
                iVar31 = (int)pFVar16->y;
                auVar34._4_4_ = iVar31;
                auVar34._0_4_ = (int)uVar26;
                auVar6._4_8_ = 0;
                auVar6._0_4_ = iVar31 >> 0x1f;
                auVar34._8_4_ = iVar31;
                auVar34._12_4_ = iVar31 >> 0x1f;
                lVar11 = (uVar26 & 0xffffffff) * (uVar14 & 0xffffffff) +
                         ((ulong)(uint)((int)uVar14 >> 0x1f) * (uVar26 & 0xffffffff) +
                          (ulong)(uint)((int)uVar26 >> 0x1f) * (uVar14 & 0xffffffff) << 0x20);
                lVar18 = (auVar34._8_8_ & 0xffffffff) * (uVar30 & 0xffffffff) +
                         ((uVar30 >> 0x20) * (auVar34._8_8_ & 0xffffffff) +
                          (SUB128(auVar6 << 0x40,4) >> 0x20) * (uVar30 & 0xffffffff) << 0x20);
                iVar31 = (int)(lVar11 >> 0x3f);
                auVar32._0_8_ = CONCAT44(iVar31,iVar31);
                auVar32._8_4_ = (int)(lVar18 >> 0x3f);
                auVar32._12_4_ = auVar32._8_4_;
                iVar31 = (int)((ulong)(auVar32._0_8_ + lVar11 + 0x8000) >> 0x10) + uVar1;
                iVar33 = (int)((ulong)(auVar32._8_8_ + lVar18 + 0x8000) >> 0x10) + uVar2;
                pFVar16->x = CONCAT44(-(uint)(iVar31 < 0),iVar31);
                *(int *)&pFVar16[1].x = iVar33;
                *(uint *)((long)&pFVar16[1].x + 4) = -(uint)(iVar33 < 0);
                pFVar16 = pFVar16 + 1;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            uVar26 = local_a0 + 1;
          } while ((FT_Pos **)uVar26 != local_98);
          return 0;
        }
        uVar22 = uVar22 + 3 & 0xfffffffc;
        if (uVar22 < 0x41) {
          local_a0 = uVar12;
          local_98 = (FT_Pos **)(ulong)uVar27;
          local_90 = puVar21;
          pPVar9 = (PFR_SubGlyphRec *)
                   ft_mem_realloc(pFVar4->memory,0x20,(ulong)glyph->max_subs,(ulong)uVar22,
                                  glyph->subs,(FT_Error *)local_78);
          glyph->subs = pPVar9;
          FVar8 = local_78._0_4_;
          if (local_78._0_4_ == 0) {
            glyph->max_subs = uVar22;
            uVar27 = (uint)local_98;
            uVar12 = local_a0;
            puVar21 = local_90;
            goto LAB_0014ad2f;
          }
          goto LAB_0014b0f9;
        }
      }
    }
    else {
      local_a4 = 0;
      if (0 < (long)size) {
        bVar7 = *pbVar3;
        uVar27 = (uint)bVar7;
        if (-1 < (char)bVar7) {
          if ((bVar7 & 4) == 0) {
            uVar22 = 0;
            if ((bVar7 & 2) == 0) {
              puVar23 = (ushort *)(pbVar3 + 1);
              uVar12 = 0;
            }
            else {
              if (size == 1) goto LAB_0014b0f4;
              uVar12 = (ulong)pbVar3[1];
              puVar23 = (ushort *)(pbVar3 + 2);
            }
            if ((bVar7 & 1) != 0) {
              if (puVar21 < (ushort *)((long)puVar23 + 1U)) goto LAB_0014b0f4;
              uVar22 = (uint)(byte)*puVar23;
              puVar23 = (ushort *)((long)puVar23 + 1U);
            }
          }
          else {
            if (size == 1) goto LAB_0014b0f4;
            puVar23 = (ushort *)(pbVar3 + 2);
            uVar12 = (ulong)(pbVar3[1] & 0xf);
            uVar22 = (uint)(pbVar3[1] >> 4);
          }
          uVar25 = (int)uVar12 + uVar22;
          if (glyph->max_xy_control < uVar25) {
            local_7c = (uint)bVar7;
            uVar27 = uVar25 + 7 & 0xfffffff8;
            local_a0 = uVar12;
            local_90 = puVar21;
            pFVar10 = (FT_Pos *)
                      ft_mem_realloc(glyph->loader->memory,8,(ulong)glyph->max_xy_control,
                                     (ulong)uVar27,glyph->x_control,&local_a4);
            glyph->x_control = pFVar10;
            FVar8 = local_a4;
            if (local_a4 != 0) goto LAB_0014b0f9;
            glyph->max_xy_control = uVar27;
            glyph->y_control = pFVar10 + (local_a0 & 0xffffffff);
            uVar12 = local_a0;
            puVar21 = local_90;
            uVar27 = local_7c;
LAB_0014ac6e:
            local_88 = (FT_GlyphLoader)&glyph->x_control;
            local_98 = &glyph->y_control;
            uVar14 = 0;
            uVar17 = 0;
            uVar26 = 0;
            puVar24 = puVar23;
            do {
              if ((uVar14 & 7) == 0) {
                if (puVar21 < (ushort *)((long)puVar24 + 1U)) goto LAB_0014b0f4;
                uVar26 = (ulong)(byte)*puVar24;
                puVar24 = (ushort *)((long)puVar24 + 1U);
              }
              if ((uVar26 & 1) == 0) {
                puVar23 = (ushort *)((long)puVar24 + 1);
                if (puVar21 < puVar23) goto LAB_0014b0f4;
                uVar17 = uVar17 + (byte)*puVar24;
              }
              else {
                puVar23 = puVar24 + 1;
                if (puVar21 < puVar23) goto LAB_0014b0f4;
                uVar17 = (int)(short)((ushort)(byte)*puVar24 << 8) |
                         (uint)*(byte *)((long)puVar24 + 1);
              }
              pFVar10[uVar14] = (long)(int)uVar17;
              uVar26 = uVar26 >> 1;
              uVar14 = uVar14 + 1;
              puVar24 = puVar23;
            } while (uVar25 != uVar14);
          }
          else {
            pFVar10 = glyph->x_control;
            glyph->y_control = pFVar10 + uVar12;
            if (uVar25 != 0) goto LAB_0014ac6e;
          }
          local_88 = (FT_GlyphLoader)&glyph->x_control;
          local_98 = &glyph->y_control;
          if ((uVar27 & 8) == 0) {
LAB_0014b147:
            glyph->path_begun = '\0';
            local_78 = (undefined1  [8])0x0;
            uStack_70 = 0;
            local_48 = (undefined1  [16])0x0;
            local_a0 = uVar12;
LAB_0014b16a:
            puVar24 = (ushort *)((long)puVar23 + 1);
            if (puVar24 <= puVar21) {
              uVar27 = (byte)*puVar23 & 0xf;
              uVar12 = (ulong)uVar27;
              bVar7 = (byte)*puVar23 >> 4;
              uVar25 = 1;
              switch(bVar7) {
              case 0:
                goto switchD_0014b19f_caseD_0;
              case 1:
              case 4:
              case 5:
                break;
              case 2:
                if (uVar27 < (uint)local_a0) {
                  local_48._0_8_ = (&local_88->memory->user)[uVar12];
                  pFVar10 = (FT_Pos *)(local_48 + 8);
                  goto LAB_0014b1ee;
                }
                goto LAB_0014b0f4;
              case 3:
                if (uVar27 < uVar22) {
                  pFVar10 = (FT_Pos *)((ulong)(uVar27 * 8) + (long)*local_98);
LAB_0014b1ee:
                  uStack_70 = *pFVar10;
                  local_78 = (undefined1  [8])local_48._0_8_;
                  local_48._8_8_ = *pFVar10;
                  goto LAB_0014b47f;
                }
                goto LAB_0014b0f4;
              case 6:
                uVar12 = 0xb8e;
                goto LAB_0014b227;
              case 7:
                uVar12 = 0xe2b;
LAB_0014b227:
                uVar25 = 3;
                break;
              default:
                uVar25 = 4;
              }
              uVar27 = 0;
              pauVar19 = (undefined1 (*) [16])local_78;
LAB_0014b23d:
              switch((uint)uVar12 & 3) {
              case 0:
                puVar23 = (ushort *)((long)puVar24 + 1);
                if (puVar21 < puVar23) goto LAB_0014b0f4;
                if ((byte)local_a0 <= (byte)*puVar24) goto LAB_0014b0f4;
                *(void **)*pauVar19 = (&local_88->memory->user)[(byte)*puVar24];
                switch((uint)(uVar12 >> 2) & 3) {
                case 0:
                  goto switchD_0014b2ed_caseD_0;
                case 1:
switchD_0014b2ed_caseD_1:
                  puVar24 = puVar23 + 1;
                  if (puVar24 <= puVar21) {
                    uVar26 = (long)(short)((ushort)(byte)*puVar23 << 8) |
                             (ulong)*(byte *)((long)puVar23 + 1);
                    break;
                  }
                  goto LAB_0014b0f4;
                case 2:
switchD_0014b2ed_caseD_2:
                  puVar24 = (ushort *)((long)puVar23 + 1);
                  if (puVar21 < puVar24) goto LAB_0014b0f4;
                  uVar26 = (long)(char)(byte)*puVar23 + local_48._8_8_;
                  break;
                case 3:
switchD_0014b2ed_caseD_3:
                  puVar24 = puVar23;
                  uVar26 = local_48._8_8_;
                }
                goto LAB_0014b39a;
              case 1:
                puVar23 = puVar24 + 1;
                if (puVar21 < puVar23) goto LAB_0014b0f4;
                *(ulong *)*pauVar19 =
                     (long)(short)((ushort)(byte)*puVar24 << 8) |
                     (ulong)*(byte *)((long)puVar24 + 1);
                switch((uint)(uVar12 >> 2) & 3) {
                case 1:
                  goto switchD_0014b2ed_caseD_1;
                case 2:
                  goto switchD_0014b2ed_caseD_2;
                case 3:
                  goto switchD_0014b2ed_caseD_3;
                }
                break;
              case 2:
                puVar23 = (ushort *)((long)puVar24 + 1);
                if (puVar21 < puVar23) goto LAB_0014b0f4;
                *(long *)*pauVar19 = (long)(char)(byte)*puVar24 + local_48._0_8_;
                switch((uint)(uVar12 >> 2) & 3) {
                case 1:
                  goto switchD_0014b2ed_caseD_1;
                case 2:
                  goto switchD_0014b2ed_caseD_2;
                case 3:
                  goto switchD_0014b2ed_caseD_3;
                }
                break;
              case 3:
                *(undefined8 *)*pauVar19 = local_48._0_8_;
                puVar23 = puVar24;
                switch((uint)(uVar12 >> 2) & 3) {
                case 1:
                  goto switchD_0014b2ed_caseD_1;
                case 2:
                  goto switchD_0014b2ed_caseD_2;
                case 3:
                  goto switchD_0014b2ed_caseD_3;
                }
              }
switchD_0014b2ed_caseD_0:
              puVar24 = (ushort *)((long)puVar23 + 1);
              if ((puVar21 < puVar24) || ((byte)uVar22 <= (byte)*puVar23)) goto LAB_0014b0f4;
              uVar26 = (*local_98)[(byte)*puVar23];
LAB_0014b39a:
              *(ulong *)(*pauVar19 + 8) = uVar26;
              if (uVar25 == 4 && uVar27 == 0) {
                if (puVar21 < (ushort *)((long)puVar24 + 1U)) goto LAB_0014b0f4;
                uVar12 = (ulong)(byte)*puVar24;
                uVar25 = 3;
                puVar24 = (ushort *)((long)puVar24 + 1U);
              }
              else {
                uVar12 = uVar12 >> 4;
              }
              local_48 = *pauVar19;
              pauVar19 = pauVar19 + 1;
              uVar27 = uVar27 + 1;
              if (uVar25 <= uVar27) goto code_r0x0014b3e4;
              goto LAB_0014b23d;
            }
            goto LAB_0014b0f4;
          }
          puVar24 = (ushort *)((long)puVar23 + 1);
          if (puVar24 <= puVar21) {
            uVar27 = (uint)(byte)*puVar23;
            if ((byte)*puVar23 != 0) {
              do {
                if ((puVar21 < puVar24 + 1) ||
                   (puVar24 = (ushort *)((long)(puVar24 + 1) + (ulong)(byte)*puVar24),
                   puVar21 < puVar24)) goto LAB_0014b0f4;
                uVar27 = uVar27 - 1;
              } while (uVar27 != 0);
            }
            local_a4 = 0;
            puVar23 = puVar24;
            goto LAB_0014b147;
          }
        }
      }
    }
  }
LAB_0014b0f4:
  FVar8 = 8;
LAB_0014b0f9:
  FT_Stream_ExitFrame(stream);
  return FVar8;
code_r0x0014b3e4:
  if (bVar7 - 1 < 3) {
LAB_0014b47f:
    local_90 = puVar21;
    FVar8 = pfr_glyph_line_to((PFR_Glyph)glyph->loader,
                              (FT_Vector *)(ulong)*(uint *)&glyph->path_begun);
  }
  else if (bVar7 - 4 < 2) {
    pFVar4 = glyph->loader;
    local_90 = puVar21;
    pfr_glyph_close_contour(glyph);
    glyph->path_begun = '\x01';
    if ((pFVar4->max_points <
         (int)(pFVar4->base).outline.n_points + (int)(pFVar4->current).outline.n_points + 1U) ||
       (bVar7 = 1,
       pFVar4->max_contours <
       (int)(pFVar4->current).outline.n_contours + (int)(pFVar4->base).outline.n_contours + 1U)) {
      FVar8 = FT_GlyphLoader_CheckPoints(pFVar4,1,1);
      if (FVar8 != 0) goto LAB_0014b49b;
      bVar7 = glyph->path_begun;
    }
    FVar8 = pfr_glyph_line_to((PFR_Glyph)glyph->loader,(FT_Vector *)(ulong)bVar7);
  }
  else {
    local_90 = puVar21;
    if (bVar7 == 0) {
switchD_0014b19f_caseD_0:
      pfr_glyph_close_contour(glyph);
      FT_GlyphLoader_Add(glyph->loader);
      FVar8 = local_a4;
      goto LAB_0014b0f9;
    }
    FVar8 = pfr_glyph_curve_to((PFR_Glyph)glyph->loader,
                               (FT_Vector *)(ulong)*(uint *)&glyph->path_begun,(FT_Vector *)local_78
                               ,local_68);
  }
LAB_0014b49b:
  puVar21 = local_90;
  puVar23 = puVar24;
  local_a4 = FVar8;
  if (FVar8 != 0) goto LAB_0014b0f9;
  goto LAB_0014b16a;
}

Assistant:

static FT_Error
  pfr_glyph_load_rec( PFR_Glyph  glyph,
                      FT_Stream  stream,
                      FT_ULong   gps_offset,
                      FT_ULong   offset,
                      FT_ULong   size )
  {
    FT_Error  error;
    FT_Byte*  p;
    FT_Byte*  limit;


    if ( FT_STREAM_SEEK( gps_offset + offset ) ||
         FT_FRAME_ENTER( size )                )
      goto Exit;

    p     = (FT_Byte*)stream->cursor;
    limit = p + size;

    if ( size > 0 && *p & PFR_GLYPH_IS_COMPOUND )
    {
      FT_UInt         n, old_count, count;
      FT_GlyphLoader  loader = glyph->loader;
      FT_Outline*     base   = &loader->base.outline;


      old_count = glyph->num_subs;

      /* this is a compound glyph - load it */
      error = pfr_glyph_load_compound( glyph, p, limit );

      FT_FRAME_EXIT();

      if ( error )
        goto Exit;

      count = glyph->num_subs - old_count;

      FT_TRACE4(( "compound glyph with %d element%s (offset %lu):\n",
                  count,
                  count == 1 ? "" : "s",
                  offset ));

      /* now, load each individual glyph */
      for ( n = 0; n < count; n++ )
      {
        FT_Int        i, old_points, num_points;
        PFR_SubGlyph  subglyph;


        FT_TRACE4(( "  subglyph %d:\n", n ));

        subglyph   = glyph->subs + old_count + n;
        old_points = base->n_points;

        error = pfr_glyph_load_rec( glyph, stream, gps_offset,
                                    subglyph->gps_offset,
                                    subglyph->gps_size );
        if ( error )
          break;

        /* note that `glyph->subs' might have been re-allocated */
        subglyph   = glyph->subs + old_count + n;
        num_points = base->n_points - old_points;

        /* translate and eventually scale the new glyph points */
        if ( subglyph->x_scale != 0x10000L || subglyph->y_scale != 0x10000L )
        {
          FT_Vector*  vec = base->points + old_points;


          for ( i = 0; i < num_points; i++, vec++ )
          {
            vec->x = FT_MulFix( vec->x, subglyph->x_scale ) +
                       subglyph->x_delta;
            vec->y = FT_MulFix( vec->y, subglyph->y_scale ) +
                       subglyph->y_delta;
          }
        }
        else
        {
          FT_Vector*  vec = loader->base.outline.points + old_points;


          for ( i = 0; i < num_points; i++, vec++ )
          {
            vec->x += subglyph->x_delta;
            vec->y += subglyph->y_delta;
          }
        }

        /* proceed to next sub-glyph */
      }

      FT_TRACE4(( "end compound glyph with %d element%s\n",
                  count,
                  count == 1 ? "" : "s" ));
    }
    else
    {
      FT_TRACE4(( "simple glyph (offset %lu)\n", offset ));

      /* load a simple glyph */
      error = pfr_glyph_load_simple( glyph, p, limit );

      FT_FRAME_EXIT();
    }

  Exit:
    return error;
  }